

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

string * cmInstallTargetGenerator::GetInstallFilename
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *config,
                   NameType nameType)

{
  bool bVar1;
  TargetType TVar2;
  Names targetNames;
  Names NStack_128;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != EXECUTABLE) {
    cmGeneratorTarget::GetLibraryNames(&NStack_128,target,config);
    switch(nameType) {
    case NameImplib:
    case NameImplibReal:
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (target,config,&NStack_128.ImportReal + (nameType == NameImplib),
                         __return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar1) {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      goto LAB_0055daa9;
    case NameSO:
      break;
    case NameReal:
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    goto LAB_0055daa9;
  }
  cmGeneratorTarget::GetExecutableNames(&NStack_128,target,config);
  if (nameType == NameImplibReal) {
    bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                      (target,config,&NStack_128.ImportReal,__return_storage_ptr__,
                       "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
LAB_0055da93:
    if (bVar1 != false) goto LAB_0055daa9;
  }
  else if ((nameType != NameReal) && (nameType == NameImplib)) {
    bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                      (target,config,&NStack_128.ImportLibrary,__return_storage_ptr__,
                       "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
    goto LAB_0055da93;
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_0055daa9:
  cmGeneratorTarget::Names::~Names(&NStack_128);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetInstallFilename(
  cmGeneratorTarget const* target, const std::string& config,
  NameType nameType)
{
  std::string fname;
  // Compute the name of the library.
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    cmGeneratorTarget::Names targetNames = target->GetExecutableNames(config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportLibrary, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportLibrary;
      }
    } else if (nameType == NameImplibReal) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportReal, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportReal;
      }
    } else if (nameType == NameReal) {
      // Use the canonical name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  } else {
    cmGeneratorTarget::Names targetNames = target->GetLibraryNames(config);
    if (nameType == NameImplib || nameType == NameImplibReal) {
      const auto& importName = nameType == NameImplib
        ? targetNames.ImportLibrary
        : targetNames.ImportReal;
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, importName, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = importName;
      }
    } else if (nameType == NameSO) {
      // Use the soname.
      fname = targetNames.SharedObject;
    } else if (nameType == NameReal) {
      // Use the real name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  }

  return fname;
}